

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall
ExprTest_HashNumericVarArgExpr_Test::TestBody(ExprTest_HashNumericVarArgExpr_Test *this)

{
  Reference RVar1;
  ExprBase args_00;
  ExprBase in_RDI;
  ExprBase in_stack_00000020;
  NumericExpr args [3];
  ExprTest *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  type_conflict tVar2;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *in_stack_ffffffffffffff98;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *this_00;
  Kind kind;
  ExprTest *in_stack_ffffffffffffffd8;
  undefined1 auStack_20 [8];
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> aBStack_18 [3];
  
  tVar2 = (type_conflict)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  RVar1 = ExprTest::MakeVariable(in_stack_ffffffffffffff88,0);
  kind = RVar1.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._4_4_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
            (in_stack_ffffffffffffff98,(Reference)in_RDI.impl_,tVar2);
  tVar2 = (type_conflict)((ulong)auStack_20 >> 0x20);
  args_00.impl_ = (Impl *)ExprTest::MakeVariable(in_stack_ffffffffffffff88,0);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
            (in_stack_ffffffffffffff98,(Reference)in_RDI.impl_,tVar2);
  this_00 = aBStack_18;
  ExprTest::MakeConst(in_stack_ffffffffffffff88,6.46286777259289e-318);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            (this_00,(NumericConstant)in_RDI.impl_,tVar2);
  ExprTest::MakeIterated<3>(in_stack_ffffffffffffffd8,kind,(NumericExpr (*) [3])args_00.impl_);
  CheckHash<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
            ((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
              )in_stack_00000020.impl_);
  ExprTest::MakeIterated<3>(in_stack_ffffffffffffffd8,kind,(NumericExpr (*) [3])args_00.impl_);
  CheckHash<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
            ((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
              )in_stack_00000020.impl_);
  ExprTest::MakeIterated<3>(in_stack_ffffffffffffffd8,kind,(NumericExpr (*) [3])args_00.impl_);
  CheckHash<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
            ((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
              )in_stack_00000020.impl_);
  return;
}

Assistant:

TEST_F(ExprTest, HashNumericVarArgExpr) {
  // Test computing hash for numeric expressions with abitrary numeric
  // arguments: VarArgExpr, SumExpr, NumberOfExpr.
  NumericExpr args[] = { MakeVariable(0), MakeVariable(1), MakeConst(42)};
  CheckHash(MakeIterated(expr::MIN, args));
  CheckHash(MakeIterated(expr::SUM, args));
  CheckHash(MakeIterated(expr::NUMBEROF, args));
}